

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl
          (XMLSchemaDescriptionImpl *this,XMLCh *targetNamespace,MemoryManager *memMgr)

{
  XMLCh *pXVar1;
  RefArrayVectorOf<char16_t> *this_00;
  
  XMLSchemaDescription::XMLSchemaDescription(&this->super_XMLSchemaDescription,memMgr);
  (this->super_XMLSchemaDescription).super_XMLGrammarDescription.super_XSerializable.
  _vptr_XSerializable = (_func_int **)&PTR__XMLSchemaDescriptionImpl_004083b0;
  this->fContextType = CONTEXT_UNKNOWN;
  this->fAttributes = (XMLAttDef *)0x0;
  this->fNamespace = (XMLCh *)0x0;
  this->fLocationHints = (RefArrayVectorOf<char16_t> *)0x0;
  this->fTriggeringComponent = (QName *)0x0;
  this->fEnclosingElementName = (QName *)0x0;
  if (targetNamespace != (XMLCh *)0x0) {
    pXVar1 = XMLString::replicate(targetNamespace,memMgr);
    this->fNamespace = pXVar1;
  }
  this_00 = (RefArrayVectorOf<char16_t> *)XMemory::operator_new(0x30,memMgr);
  RefArrayVectorOf<char16_t>::RefArrayVectorOf(this_00,4,true,memMgr);
  this->fLocationHints = this_00;
  return;
}

Assistant:

XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl(const XMLCh* const   targetNamespace
                                                 , MemoryManager* const memMgr)
:XMLSchemaDescription(memMgr)
,fContextType(CONTEXT_UNKNOWN)
,fNamespace(0)
,fLocationHints(0)
,fTriggeringComponent(0)
,fEnclosingElementName(0)
,fAttributes(0) 
{
    if (targetNamespace)
        fNamespace = XMLString::replicate(targetNamespace, memMgr);


    fLocationHints =  new (memMgr) RefArrayVectorOf<XMLCh>(4, true, memMgr);

    /***
        fAttributes
    ***/
}